

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ahrens_beylkin.hpp
# Opt level: O3

int64_t IntegratorXX::quadrature_traits<IntegratorXX::AhrensBeylkin<double>,_void>::
        algebraic_order_by_npts(int64_t npts)

{
  if (npts < 0x8b8) {
    if (npts < 0x408) {
      if (npts < 0x228) {
        if (npts < 0x138) {
          if (npts == 0x48) {
            return 0xe;
          }
          if (npts == 0x84) {
            return 0x13;
          }
          if (npts == 0xc0) {
            return 0x17;
          }
        }
        else if (npts < 0x1b0) {
          if (npts == 0x138) {
            return 0x1d;
          }
          if (npts == 0x174) {
            return 0x20;
          }
        }
        else {
          if (npts == 0x1b0) {
            return 0x23;
          }
          if (npts == 0x1ec) {
            return 0x25;
          }
        }
      }
      else if (npts < 0x2dc) {
        if (npts == 0x228) {
          return 0x27;
        }
        if (npts == 0x264) {
          return 0x29;
        }
        if (npts == 0x2a0) {
          return 0x2c;
        }
      }
      else if (npts < 0x390) {
        if (npts == 0x2dc) {
          return 0x2d;
        }
        if (npts == 0x318) {
          return 0x2f;
        }
      }
      else {
        if (npts == 0x390) {
          return 0x33;
        }
        if (npts == 0x3cc) {
          return 0x35;
        }
      }
    }
    else if (npts < 0x660) {
      if (npts < 0x534) {
        if (npts == 0x408) {
          return 0x36;
        }
        if (npts == 0x444) {
          return 0x38;
        }
        if (npts == 0x4f8) {
          return 0x3c;
        }
      }
      else if (npts < 0x5e8) {
        if (npts == 0x534) {
          return 0x3e;
        }
        if (npts == 0x570) {
          return 0x3f;
        }
      }
      else {
        if (npts == 0x5e8) {
          return 0x42;
        }
        if (npts == 0x624) {
          return 0x43;
        }
      }
    }
    else if (npts < 0x78c) {
      if (npts == 0x660) {
        return 0x45;
      }
      if (npts == 0x69c) {
        return 0x46;
      }
      if (npts == 0x714) {
        return 0x48;
      }
    }
    else if (npts < 0x840) {
      if (npts == 0x78c) {
        return 0x4b;
      }
      if (npts == 0x7c8) {
        return 0x4c;
      }
    }
    else {
      if (npts == 0x840) {
        return 0x4e;
      }
      if (npts == 0x87c) {
        return 0x4f;
      }
    }
  }
  else if (npts < 0x1074) {
    if (npts < 0xbc4) {
      if (npts < 0x9a8) {
        if (npts == 0x8b8) {
          return 0x50;
        }
        if (npts == 0x8f4) {
          return 0x51;
        }
        if (npts == 0x96c) {
          return 0x54;
        }
      }
      else if (npts < 0xad4) {
        if (npts == 0x9a8) {
          return 0x55;
        }
        if (npts == 0xa98) {
          return 0x59;
        }
      }
      else {
        if (npts == 0xad4) {
          return 0x5a;
        }
        if (npts == 0xb10) {
          return 0x5b;
        }
      }
    }
    else if (npts < 0xd68) {
      if (npts == 0xbc4) {
        return 0x5e;
      }
      if (npts == 0xcf0) {
        return 0x62;
      }
      if (npts == 0xd2c) {
        return 99;
      }
    }
    else if (npts < 0xe1c) {
      if (npts == 0xd68) {
        return 100;
      }
      if (npts == 0xda4) {
        return 0x65;
      }
    }
    else {
      if (npts == 0xe1c) {
        return 0x67;
      }
      if (npts == 0xed0) {
        return 0x69;
      }
    }
  }
  else if (npts < 0x15d8) {
    if (npts < 0x1254) {
      if (npts == 0x1074) {
        return 0x6f;
      }
      if (npts == 0x10ec) {
        return 0x71;
      }
      if (npts == 0x11dc) {
        return 0x74;
      }
    }
    else if (npts < 0x1470) {
      if (npts == 0x1254) {
        return 0x75;
      }
      if (npts == 0x1380) {
        return 0x79;
      }
    }
    else {
      if (npts == 0x1470) {
        return 0x7c;
      }
      if (npts == 0x1560) {
        return 0x7f;
      }
    }
  }
  else if (npts < 0x18a8) {
    if (npts == 0x15d8) {
      return 0x80;
    }
    if (npts == 0x168c) {
      return 0x82;
    }
    if (npts == 0x1830) {
      return 0x87;
    }
  }
  else if (npts < 0x1d58) {
    if (npts == 0x18a8) {
      return 0x88;
    }
    if (npts == 0x1b00) {
      return 0x8f;
    }
  }
  else {
    if (npts == 0x1d58) {
      return 0x95;
    }
    if (npts == 0x3aa4) {
      return 0xd2;
    }
  }
  return -1;
}

Assistant:

inline static int64_t algebraic_order_by_npts(int64_t npts) {
  switch (npts) {
  case 72:
    return 14;
  case 132:
    return 19;
  case 192:
    return 23;
  case 312:
    return 29;
  case 372:
    return 32;
  case 432:
    return 35;
  case 492:
    return 37;
  case 552:
    return 39;
  case 612:
    return 41;
  case 672:
    return 44;
  case 732:
    return 45;
  case 792:
    return 47;
  case 912:
    return 51;
  case 972:
    return 53;
  case 1032:
    return 54;
  case 1092:
    return 56;
  case 1272:
    return 60;
  case 1332:
    return 62;
  case 1392:
    return 63;
  case 1512:
    return 66;
  case 1572:
    return 67;
  case 1632:
    return 69;
  case 1692:
    return 70;
  case 1812:
    return 72;
  case 1932:
    return 75;
  case 1992:
    return 76;
  case 2112:
    return 78;
  case 2172:
    return 79;
  case 2232:
    return 80;
  case 2292:
    return 81;
  case 2412:
    return 84;
  case 2472:
    return 85;
  case 2712:
    return 89;
  case 2772:
    return 90;
  case 2832:
    return 91;
  case 3012:
    return 94;
  case 3312:
    return 98;
  case 3372:
    return 99;
  case 3432:
    return 100;
  case 3492:
    return 101;
  case 3612:
    return 103;
  case 3792:
    return 105;
  case 4212:
    return 111;
  case 4332:
    return 113;
  case 4572:
    return 116;
  case 4692:
    return 117;
  case 4992:
    return 121;
  case 5232:
    return 124;
  case 5472:
    return 127;
  case 5592:
    return 128;
  case 5772:
    return 130;
  case 6192:
    return 135;
  case 6312:
    return 136;
  case 6912:
    return 143;
  case 7512:
    return 149;
  case 15012:
    return 210;
  default:
    return -1;
  }
}